

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O2

void __thiscall
UnitTest::XmlTestReporter::ReportSummary
          (XmlTestReporter *this,int totalTestCount,int failedTestCount,int failureCount,
          float secondsElapsed)

{
  DeferredTestResultList *pDVar1;
  XmlTestReporter *pXVar2;
  pointer result;
  
  pXVar2 = this;
  AddXmlElement(this,this->m_ostream,(char *)0x0);
  BeginResults(pXVar2,this->m_ostream,totalTestCount,failedTestCount,failureCount,secondsElapsed);
  pXVar2 = this;
  pDVar1 = DeferredTestReporter::GetResults(&this->super_DeferredTestReporter);
  for (result = (pDVar1->
                super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
                )._M_impl.super__Vector_impl_data._M_start;
      result != (pDVar1->
                super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
                )._M_impl.super__Vector_impl_data._M_finish; result = result + 1) {
    BeginTest(pXVar2,this->m_ostream,result);
    if (result->failed == true) {
      AddFailure(pXVar2,this->m_ostream,result);
    }
    EndTest(pXVar2,this->m_ostream,result);
  }
  std::operator<<(this->m_ostream,"</unittest-results>");
  return;
}

Assistant:

void XmlTestReporter::ReportSummary(int totalTestCount, int failedTestCount,
                                    int failureCount, float secondsElapsed)
{
    AddXmlElement(m_ostream, NULL);

    BeginResults(m_ostream, totalTestCount, failedTestCount, failureCount, secondsElapsed);

    DeferredTestResultList const& results = GetResults();
    for (DeferredTestResultList::const_iterator i = results.begin(); i != results.end(); ++i)
    {
        BeginTest(m_ostream, *i);

        if (i->failed)
            AddFailure(m_ostream, *i);

        EndTest(m_ostream, *i);
    }

    EndResults(m_ostream);
}